

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_q4_K_ref(float *x,block_q4_K *y,int64_t k)

{
  ggml_fp16_t gVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar5;
  float fVar6;
  int l_3;
  int j_3;
  uint8_t *q;
  int l_2;
  int ii;
  float dm;
  float d;
  int j_2;
  uint8_t m;
  uint8_t sc;
  uint8_t lm;
  uint8_t ls;
  int j_1;
  float inv_min;
  float inv_scale;
  float min;
  float scale;
  int l_1;
  float av_x;
  int l;
  float sum_x2;
  int j;
  float max_min;
  float max_scale;
  int i;
  float scales [8];
  float mins [8];
  float weights [32];
  uint8_t Laux [32];
  uint8_t L [256];
  int nb;
  float local_284;
  byte local_280;
  float in_stack_fffffffffffffd84;
  uint local_278;
  uint local_274;
  float local_270;
  float local_26c;
  int local_268;
  int local_264;
  long local_260;
  int local_250;
  int local_244;
  byte local_240;
  byte local_23f;
  undefined1 local_23e;
  byte local_23d;
  int local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  int local_228;
  float local_224;
  int local_220;
  float local_21c;
  int local_218;
  float rmin;
  float *in_stack_fffffffffffffdf8;
  uint8_t *in_stack_fffffffffffffe00;
  float *in_stack_fffffffffffffe08;
  float *in_stack_fffffffffffffe10;
  float local_1e8;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  uint8_t *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  byte local_128 [268];
  int local_1c;
  long local_10;
  long local_8;
  
  local_1c = (int)(in_RDX / 0x100);
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (rmin = 0.0; (int)rmin < local_1c; rmin = (float)((int)rmin + 1)) {
    local_26c = 0.0;
    local_270 = 0.0;
    for (local_218 = 0; local_218 < 8; local_218 = local_218 + 1) {
      local_21c = 0.0;
      for (local_220 = 0; local_220 < 0x20; local_220 = local_220 + 1) {
        local_21c = *(float *)(local_8 + (long)(local_218 * 0x20 + local_220) * 4) *
                    *(float *)(local_8 + (long)(local_218 * 0x20 + local_220) * 4) + local_21c;
      }
      local_224 = sqrtf(local_21c / 32.0);
      for (local_228 = 0; local_228 < 0x20; local_228 = local_228 + 1) {
        *(float *)(&stack0xfffffffffffffe38 + (long)local_228 * 4) =
             local_224 + ABS(*(float *)(local_8 + (long)(local_218 * 0x20 + local_228) * 4));
      }
      fVar5 = make_qkx2_quants(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                               in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                               in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                               in_stack_fffffffffffffe30,rmin,local_26c,in_stack_fffffffffffffe38,
                               SUB41((uint)local_270 >> 0x18,0));
      *(float *)(&stack0xfffffffffffffdf8 + (long)local_218 * 4) = fVar5;
      local_22c = *(float *)(&stack0xfffffffffffffdf8 + (long)local_218 * 4);
      if (local_26c < local_22c) {
        local_26c = local_22c;
      }
      local_230 = (&local_1e8)[local_218];
      if (local_270 < local_230) {
        local_270 = local_230;
      }
    }
    if (local_26c <= 0.0) {
      local_26c = 0.0;
    }
    else {
      local_26c = 63.0 / local_26c;
    }
    local_234 = local_26c;
    if (local_270 <= 0.0) {
      local_270 = 0.0;
    }
    else {
      local_270 = 63.0 / local_270;
    }
    local_238 = local_270;
    for (local_23c = 0; local_23c < 8; local_23c = local_23c + 1) {
      iVar2 = nearest_int(local_234 * *(float *)(&stack0xfffffffffffffdf8 + (long)local_23c * 4));
      local_23d = (byte)iVar2;
      local_278 = nearest_int(local_238 * (&local_1e8)[local_23c]);
      if (local_23d < 0x40) {
        local_274 = (uint)local_23d;
      }
      else {
        local_274 = 0x3f;
      }
      local_23d = (byte)local_274;
      if ((byte)local_278 < 0x40) {
        local_278 = local_278 & 0xff;
      }
      else {
        local_278 = 0x3f;
      }
      local_23e = (undefined1)local_278;
      if (local_23c < 4) {
        *(byte *)(local_10 + (long)(int)rmin * 0x90 + 4 + (long)local_23c) = local_23d;
        *(undefined1 *)(local_10 + (long)(int)rmin * 0x90 + 4 + (long)(local_23c + 4)) = local_23e;
      }
      else {
        *(byte *)(local_10 + (long)(int)rmin * 0x90 + 4 + (long)(local_23c + 4)) =
             local_23d & 0xf | (byte)((local_278 & 0xf) << 4);
        lVar4 = local_10 + (long)(int)rmin * 0x90;
        *(byte *)(lVar4 + 4 + (long)(local_23c + -4)) =
             *(byte *)(lVar4 + 4 + (long)(local_23c + -4)) | (byte)(((int)local_274 >> 4) << 6);
        lVar4 = local_10 + (long)(int)rmin * 0x90;
        *(byte *)(lVar4 + 4 + (long)local_23c) =
             *(byte *)(lVar4 + 4 + (long)local_23c) | (byte)(((int)local_278 >> 4) << 6);
      }
    }
    gVar1 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffd84);
    *(ggml_fp16_t *)(local_10 + (long)(int)rmin * 0x90) = gVar1;
    gVar1 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffd84);
    *(ggml_fp16_t *)(local_10 + (long)(int)rmin * 0x90 + 2) = gVar1;
    for (local_244 = 0; local_244 < 8; local_244 = local_244 + 1) {
      get_scale_min_k4(local_244,(uint8_t *)(local_10 + (long)(int)rmin * 0x90 + 4),&local_23f,
                       &local_240);
      fVar5 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_10 + (long)(int)rmin * 0x90));
      fVar5 = fVar5 * (float)local_23f;
      if ((fVar5 != 0.0) || (NAN(fVar5))) {
        fVar6 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_10 + (long)(int)rmin * 0x90 + 2));
        uVar3 = (uint)local_240;
        for (local_250 = 0; local_250 < 0x20; local_250 = local_250 + 1) {
          local_284 = (float)nearest_int((*(float *)(local_8 +
                                                    (long)(local_244 * 0x20 + local_250) * 4) +
                                         fVar6 * (float)uVar3) / fVar5);
          in_stack_fffffffffffffd84 = local_284;
          if (0xf < (int)local_284) {
            in_stack_fffffffffffffd84 = 2.10195e-44;
          }
          if ((int)in_stack_fffffffffffffd84 < 0) {
            local_280 = 0;
          }
          else {
            if (0xf < (int)local_284) {
              local_284 = 2.10195e-44;
            }
            local_280 = SUB41(local_284,0);
          }
          local_128[local_244 * 0x20 + local_250] = local_280;
        }
      }
    }
    local_260 = local_10 + (long)(int)rmin * 0x90 + 0x10;
    for (local_264 = 0; local_264 < 0x100; local_264 = local_264 + 0x40) {
      for (local_268 = 0; local_268 < 0x20; local_268 = local_268 + 1) {
        *(byte *)(local_260 + local_268) =
             local_128[local_264 + local_268] | local_128[local_264 + local_268 + 0x20] << 4;
      }
      local_260 = local_260 + 0x20;
    }
    local_8 = local_8 + 0x400;
  }
  return;
}

Assistant:

void quantize_row_q4_K_ref(const float * GGML_RESTRICT x, block_q4_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    uint8_t L[QK_K];
    uint8_t Laux[32];
    float   weights[32];
    float mins[QK_K/32];
    float scales[QK_K/32];

    for (int i = 0; i < nb; i++) {
        float max_scale = 0; // as we are deducting the min, scales are always positive
        float max_min = 0;
        for (int j = 0; j < QK_K/32; ++j) {
            //scales[j] = make_qkx1_quants(32, 15, x + 32*j, L + 32*j, &mins[j], 9, 0.5f);
            float sum_x2 = 0;
            for (int l = 0; l < 32; ++l) sum_x2 += x[32*j + l] * x[32*j + l];
            float av_x = sqrtf(sum_x2/32);
            for (int l = 0; l < 32; ++l) weights[l] = av_x + fabsf(x[32*j + l]);
            scales[j] = make_qkx2_quants(32, 15, x + 32*j, weights, L + 32*j, &mins[j], Laux, -1.f, 0.1f, 20, false);
            float scale = scales[j];
            if (scale > max_scale) {
                max_scale = scale;
            }
            float min = mins[j];
            if (min > max_min) {
                max_min = min;
            }
        }

        float inv_scale = max_scale > 0 ? 63.f/max_scale : 0.f;
        float inv_min   = max_min   > 0 ? 63.f/max_min   : 0.f;
        for (int j = 0; j < QK_K/32; ++j) {
            uint8_t ls = nearest_int(inv_scale*scales[j]);
            uint8_t lm = nearest_int(inv_min*mins[j]);
            ls = MIN(63, ls);
            lm = MIN(63, lm);
            if (j < 4) {
                y[i].scales[j] = ls;
                y[i].scales[j+4] = lm;
            } else {
                y[i].scales[j+4] = (ls & 0xF) | ((lm & 0xF) << 4);
                y[i].scales[j-4] |= ((ls >> 4) << 6);
                y[i].scales[j-0] |= ((lm >> 4) << 6);
            }
        }
        y[i].d = GGML_FP32_TO_FP16(max_scale/63.f);
        y[i].dmin = GGML_FP32_TO_FP16(max_min/63.f);

        uint8_t sc, m;
        for (int j = 0; j < QK_K/32; ++j) {
            get_scale_min_k4(j, y[i].scales, &sc, &m);
            const float d = GGML_FP16_TO_FP32(y[i].d) * sc;
            if (!d) continue;
            const float dm = GGML_FP16_TO_FP32(y[i].dmin) * m;
            for (int ii = 0; ii < 32; ++ii) {
                int l = nearest_int((x[32*j + ii] + dm)/d);
                l = MAX(0, MIN(15, l));
                L[32*j + ii] = l;
            }
        }

        uint8_t * q = y[i].qs;
        for (int j = 0; j < QK_K; j += 64) {
            for (int l = 0; l < 32; ++l) q[l] = L[j + l] | (L[j + l + 32] << 4);
            q += 32;
        }

        x += QK_K;
    }
}